

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

void init_motion_compensation_square(search_site_config *cfg,int stride,int level)

{
  search_site *psVar1;
  FULLPEL_MV FVar2;
  FULLPEL_MV FVar3;
  int iVar4;
  FULLPEL_MV (*paFVar5) [8];
  long lVar6;
  search_site_config *psVar7;
  long lVar8;
  search_site sVar9;
  
  cfg->stride = stride;
  iVar4 = 1;
  paFVar5 = init_motion_compensation_square::square_candidates;
  lVar6 = 0;
  psVar7 = cfg;
  do {
    cfg->searches_per_step[lVar6] = 8;
    cfg->radius[lVar6] = iVar4;
    lVar8 = 0;
    do {
      FVar2 = (*paFVar5)[lVar8];
      FVar3 = (*paFVar5 + lVar8)[1];
      sVar9.offset = ((int)FVar2 >> 0x10) + FVar2.row * stride;
      sVar9.mv = FVar2;
      psVar1 = psVar7->site[0] + lVar8;
      *psVar1 = sVar9;
      psVar1[2].mv = FVar3;
      psVar1[2].offset = ((int)FVar3 >> 0x10) + FVar3.row * stride;
      lVar8 = lVar8 + 2;
    } while (lVar8 != 8);
    iVar4 = iVar4 * 2;
    lVar6 = lVar6 + 1;
    psVar7 = (search_site_config *)(psVar7->site + 1);
    paFVar5 = paFVar5 + 1;
  } while (lVar6 != 0xb);
  cfg->num_search_steps = 0xb;
  return;
}

Assistant:

static void init_motion_compensation_square(search_site_config *cfg, int stride,
                                            int level) {
  (void)level;
  cfg->stride = stride;
  // All scales have 8 closest points in square shape.
  static const int square_num_candidates[MAX_PATTERN_SCALES] = {
    8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8,
  };

  // Square search method candidates.
  // Note that the largest candidate step at each scale is 2^scale.
  /* clang-format off */
    static const FULLPEL_MV
        square_candidates[MAX_PATTERN_SCALES][MAX_PATTERN_CANDIDATES] = {
             { { -1, -1 }, { 0, -1 }, { 1, -1 }, { 1, 0 }, { 1, 1 }, { 0, 1 },
               { -1, 1 }, { -1, 0 } },
             { { -2, -2 }, { 0, -2 }, { 2, -2 }, { 2, 0 }, { 2, 2 }, { 0, 2 },
               { -2, 2 }, { -2, 0 } },
             { { -4, -4 }, { 0, -4 }, { 4, -4 }, { 4, 0 }, { 4, 4 }, { 0, 4 },
               { -4, 4 }, { -4, 0 } },
             { { -8, -8 }, { 0, -8 }, { 8, -8 }, { 8, 0 }, { 8, 8 }, { 0, 8 },
               { -8, 8 }, { -8, 0 } },
             { { -16, -16 }, { 0, -16 }, { 16, -16 }, { 16, 0 }, { 16, 16 },
               { 0, 16 }, { -16, 16 }, { -16, 0 } },
             { { -32, -32 }, { 0, -32 }, { 32, -32 }, { 32, 0 }, { 32, 32 },
               { 0, 32 }, { -32, 32 }, { -32, 0 } },
             { { -64, -64 }, { 0, -64 }, { 64, -64 }, { 64, 0 }, { 64, 64 },
               { 0, 64 }, { -64, 64 }, { -64, 0 } },
             { { -128, -128 }, { 0, -128 }, { 128, -128 }, { 128, 0 },
               { 128, 128 }, { 0, 128 }, { -128, 128 }, { -128, 0 } },
             { { -256, -256 }, { 0, -256 }, { 256, -256 }, { 256, 0 },
               { 256, 256 }, { 0, 256 }, { -256, 256 }, { -256, 0 } },
             { { -512, -512 }, { 0, -512 }, { 512, -512 }, { 512, 0 },
               { 512, 512 }, { 0, 512 }, { -512, 512 }, { -512, 0 } },
             { { -1024, -1024 }, { 0, -1024 }, { 1024, -1024 }, { 1024, 0 },
               { 1024, 1024 }, { 0, 1024 }, { -1024, 1024 }, { -1024, 0 } },
    };

  /* clang-format on */
  int radius = 1;
  for (int i = 0; i < MAX_PATTERN_SCALES; ++i) {
    cfg->searches_per_step[i] = square_num_candidates[i];
    cfg->radius[i] = radius;
    for (int j = 0; j < MAX_PATTERN_CANDIDATES; ++j) {
      search_site *const site = &cfg->site[i][j];
      site->mv = square_candidates[i][j];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    radius *= 2;
  }
  cfg->num_search_steps = MAX_PATTERN_SCALES;
}